

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getaddrinfo.c
# Opt level: O2

int run_test_getaddrinfo_fail_sync(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_b0;
  uv_getaddrinfo_t req;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_getaddrinfo(puVar2,&req,(uv_getaddrinfo_cb)0x0,"xyzzy.xyzzy.xyzzy.",(char *)0x0,
                         (addrinfo *)0x0);
  if (iVar1 < 0) {
    uv_freeaddrinfo(req.addrinfo);
    puVar2 = uv_default_loop();
    close_loop(puVar2);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
    pcVar3 = "0 == uv_loop_close(uv_default_loop())";
    uStack_b0 = 0x78;
  }
  else {
    pcVar3 = "0 > uv_getaddrinfo(uv_default_loop(), &req, NULL, \"xyzzy.xyzzy.xyzzy.\", NULL, NULL)"
    ;
    uStack_b0 = 0x75;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-getaddrinfo.c"
          ,uStack_b0,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(getaddrinfo_fail_sync) {
  uv_getaddrinfo_t req;

  /* Use a FQDN by ending in a period */
  ASSERT(0 > uv_getaddrinfo(uv_default_loop(),
                            &req,
                            NULL,
                            "xyzzy.xyzzy.xyzzy.",
                            NULL,
                            NULL));
  uv_freeaddrinfo(req.addrinfo);

  MAKE_VALGRIND_HAPPY();
  return 0;
}